

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QGate1<std::complex<float>_>::apply
          (QGate1<std::complex<float>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<float>_> *matrix,int offset)

{
  long lVar1;
  int iVar2;
  int64_t iVar3;
  long lVar4;
  complex<float> *pcVar5;
  byte bVar6;
  byte bVar7;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  complex<float> local_158;
  complex<float> local_150;
  _ComplexT local_148;
  complex<float> local_140;
  complex<float> local_138;
  _ComplexT local_130;
  complex<float> local_128;
  complex<float> x2_1;
  complex<float> x1_1;
  int64_t i2;
  int64_t i1;
  int64_t i_1;
  int64_t k_1;
  int64_t j_1;
  int64_t nRight_1;
  int64_t nLeft_1;
  SquareMatrix<std::complex<float>_> local_d0;
  complex<float> local_c0;
  complex<float> local_b8;
  _ComplexT local_b0;
  complex<float> local_a8;
  complex<float> local_a0;
  _ComplexT local_98;
  complex<float> local_90;
  complex<float> x2;
  complex<float> x1;
  int64_t j2;
  int64_t j1;
  int64_t j;
  int64_t k;
  int64_t i;
  int64_t nRight;
  int64_t nLeft;
  undefined1 local_38 [8];
  SquareMatrix<std::complex<float>_> mat1;
  int qubit;
  int offset_local;
  SquareMatrix<std::complex<float>_> *matrix_local;
  int nbQubits_local;
  Op op_local;
  Side side_local;
  QGate1<std::complex<float>_> *this_local;
  
  mat1.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl._4_4_ = offset;
  if (nbQubits < 1) {
    __assert_fail("nbQubits >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x1f,
                  "virtual void qclab::qgates::QGate1<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  iVar3 = dense::SquareMatrix<std::complex<float>_>::size(matrix);
  bVar6 = (byte)nbQubits;
  if (iVar3 != 1 << (bVar6 & 0x1f)) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x20,
                  "virtual void qclab::qgates::QGate1<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  iVar2 = (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[3])();
  mat1.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl._0_4_ =
       iVar2 + mat1.data_._M_t.
               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl._4_4_;
  if (nbQubits <=
      (int)mat1.data_._M_t.
           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
           _M_t.
           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
           .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl) {
    __assert_fail("qubit < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x22,
                  "virtual void qclab::qgates::QGate1<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[7])();
  dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            (op,(SquareMatrix<std::complex<float>_> *)local_38);
  bVar7 = (byte)(int)mat1.data_._M_t.
                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                     .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  if (side == Left) {
    if (nbQubits == 1) {
      dense::SquareMatrix<std::complex<float>_>::operator*=
                (matrix,(SquareMatrix<std::complex<float>_> *)local_38);
    }
    else {
      lVar4 = (long)(1 << ((bVar6 - bVar7) - 1 & 0x1f));
      for (k = 0; iVar3 = dense::SquareMatrix<std::complex<float>_>::rows(matrix), k < iVar3;
          k = k + 1) {
        for (j = 0; j < 1 << (bVar7 & 0x1f); j = j + 1) {
          for (j1 = 0; j1 < lVar4; j1 = j1 + 1) {
            lVar1 = j1 + j * lVar4 * 2;
            pcVar5 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,k,lVar1);
            x2._M_value = pcVar5->_M_value;
            pcVar5 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,k,lVar1 + lVar4);
            local_90._M_value = pcVar5->_M_value;
            pcVar5 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_38,0,0);
            std::operator*(pcVar5,&x2);
            pcVar5 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_38,1,0);
            std::operator*(pcVar5,&local_90);
            std::operator+(&local_a0,&local_a8);
            local_98 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
            pcVar5 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,k,lVar1);
            pcVar5->_M_value = local_98;
            pcVar5 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_38,0,1);
            std::operator*(pcVar5,&x2);
            pcVar5 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_38,1,1);
            std::operator*(pcVar5,&local_90);
            std::operator+(&local_b8,&local_c0);
            local_b0 = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
            pcVar5 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,k,lVar1 + lVar4);
            pcVar5->_M_value = local_b0;
          }
        }
      }
    }
  }
  else if (nbQubits == 1) {
    dense::SquareMatrix<std::complex<float>_>::SquareMatrix
              ((SquareMatrix<std::complex<float>_> *)&nLeft_1,
               (SquareMatrix<std::complex<float>_> *)local_38);
    dense::operator*((dense *)&local_d0,(SquareMatrix<std::complex<float>_> *)&nLeft_1,matrix);
    dense::SquareMatrix<std::complex<float>_>::operator=(matrix,&local_d0);
    dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_d0);
    dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
              ((SquareMatrix<std::complex<float>_> *)&nLeft_1);
  }
  else {
    lVar4 = (long)(1 << ((bVar6 - bVar7) - 1 & 0x1f));
    for (k_1 = 0; iVar3 = dense::SquareMatrix<std::complex<float>_>::cols(matrix), k_1 < iVar3;
        k_1 = k_1 + 1) {
      for (i_1 = 0; i_1 < 1 << (bVar7 & 0x1f); i_1 = i_1 + 1) {
        for (i1 = 0; i1 < lVar4; i1 = i1 + 1) {
          lVar1 = i1 + i_1 * lVar4 * 2;
          pcVar5 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,lVar1,k_1);
          x2_1._M_value = pcVar5->_M_value;
          pcVar5 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,lVar1 + lVar4,k_1);
          local_128._M_value = pcVar5->_M_value;
          pcVar5 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_38,0,0);
          std::operator*(pcVar5,&x2_1);
          pcVar5 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_38,0,1);
          std::operator*(pcVar5,&local_128);
          std::operator+(&local_138,&local_140);
          local_130 = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
          pcVar5 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,lVar1,k_1);
          pcVar5->_M_value = local_130;
          pcVar5 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_38,1,0);
          std::operator*(pcVar5,&x2_1);
          pcVar5 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_38,1,1);
          std::operator*(pcVar5,&local_128);
          std::operator+(&local_150,&local_158);
          local_148 = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
          pcVar5 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,lVar1 + lVar4,k_1);
          pcVar5->_M_value = local_148;
        }
      }
    }
  }
  dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_38);
  return;
}

Assistant:

QGate1( const int qubit )
        : qubit_( qubit )
        {
          assert( qubit >= 0 ) ;
        }